

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFront.c
# Opt level: O2

int Gia_ManCrossCutSimple(Gia_Man_t *p)

{
  uint *puVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int v;
  int iVar5;
  int iVar6;
  
  Gia_ManCreateValueRefs(p);
  v = 0;
  iVar5 = 0;
  iVar6 = 0;
  do {
    if (p->nObjs <= v) {
      return iVar6;
    }
    pGVar3 = Gia_ManObj(p,v);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      return iVar6;
    }
    iVar5 = (iVar5 + 1) - (uint)(pGVar3->Value == 0);
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
    uVar2 = *(ulong *)pGVar3;
    uVar4 = uVar2 & 0x1fffffff;
    if (uVar4 == 0x1fffffff || (int)uVar2 < 0) {
      if ((int)uVar2 < 0 && (int)uVar4 != 0x1fffffff) goto LAB_0059d5cb;
    }
    else {
      puVar1 = &pGVar3[-uVar4].Value;
      *puVar1 = *puVar1 - 1;
      iVar5 = iVar5 - (uint)(*puVar1 == 0);
      uVar4 = (ulong)((uint)(uVar2 >> 0x20) & 0x1fffffff);
LAB_0059d5cb:
      puVar1 = &pGVar3[-uVar4].Value;
      *puVar1 = *puVar1 - 1;
      iVar5 = iVar5 - (uint)(*puVar1 == 0);
    }
    v = v + 1;
  } while( true );
}

Assistant:

int Gia_ManCrossCutSimple( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nCutCur = 0, nCutMax = 0;
    Gia_ManCreateValueRefs( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
            if ( --Gia_ObjFanin1(pObj)->Value == 0 )
                nCutCur--;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
        }
    }
//    Gia_ManForEachObj( p, pObj, i )
//        assert( pObj->Value == 0 );
    return nCutMax;
}